

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  iovec *__iovec;
  undefined1 *puVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  iovec *piVar5;
  long lVar6;
  iovec *piVar7;
  Fault f;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  Fault local_150;
  iovec *local_148;
  undefined1 *puStack_140;
  undefined8 *local_138;
  iovec local_128 [16];
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  if ((void *)0x400 < __buf) {
    do {
      iVar2 = (*(this->super_OutputStream)._vptr_OutputStream[3])(this,lVar6,0x400);
      in_RAX = CONCAT44(extraout_var,iVar2);
      lVar6 = lVar6 + 0x4000;
      __buf = (void *)((long)__buf + -0x400);
    } while ((undefined1 *)0x400 < __buf);
  }
  if (&DAT_00000010 < __buf) {
    __iovec = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                 (0x10,(size_t)__buf,(size_t)__buf,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
    local_138 = &kj::_::HeapArrayDisposer::instance;
    local_148 = __iovec;
    puStack_140 = (undefined1 *)__buf;
  }
  else {
    local_148 = (iovec *)0x0;
    puStack_140 = (undefined1 *)0x0;
    local_138 = (undefined8 *)0x0;
    if ((undefined1 *)__buf == (undefined1 *)0x0) {
      piVar7 = local_128;
      __iovec = local_128;
      goto LAB_00483914;
    }
    __iovec = local_128;
  }
  in_RAX = 8;
  puVar3 = (undefined1 *)0x1;
  do {
    *(undefined8 *)((long)__iovec + (in_RAX - 8)) = *(undefined8 *)(lVar6 + -8 + in_RAX);
    *(undefined8 *)((long)&__iovec->iov_base + in_RAX) = *(undefined8 *)(lVar6 + in_RAX);
    in_RAX = in_RAX + 0x10;
    bVar1 = puVar3 < __buf;
    puVar3 = (undefined1 *)(ulong)((int)puVar3 + 1);
  } while (bVar1);
  piVar7 = __iovec + (long)__buf;
  do {
    if (__iovec->iov_len != 0) break;
    __iovec = __iovec + 1;
  } while (__iovec < piVar7);
LAB_00483914:
  piVar5 = local_148;
  if (__iovec < piVar7) {
    do {
      while( true ) {
        in_RAX = writev(this->fd,__iovec,(int)((ulong)((long)piVar7 - (long)__iovec) >> 4));
        if (-1 < (long)in_RAX) break;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
        if (iVar2 != -1) {
          if (iVar2 != 0) {
            kj::_::Debug::Fault::Fault<int,int&>
                      (&local_150,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                       ,0x196,iVar2,"n = ::writev(fd, current, iov.end() - current)","fd",&this->fd)
            ;
            kj::_::Debug::Fault::fatal(&local_150);
          }
          goto LAB_004839bb;
        }
      }
      if (in_RAX == 0) {
LAB_004839bb:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  (&local_150,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x197,FAILED,"n > 0","\"writev() returned zero.\"",
                   (char (*) [24])"writev() returned zero.");
        kj::_::Debug::Fault::fatal(&local_150);
      }
      if (__iovec < piVar7) {
        do {
          uVar4 = in_RAX - __iovec->iov_len;
          if (in_RAX < __iovec->iov_len) break;
          __iovec = __iovec + 1;
          in_RAX = uVar4;
        } while (__iovec < piVar7);
        if (0 < (long)in_RAX) goto LAB_00483970;
      }
      else {
LAB_00483970:
        __iovec->iov_base = (void *)((long)__iovec->iov_base + in_RAX);
        __iovec->iov_len = __iovec->iov_len - in_RAX;
      }
      piVar5 = local_148;
    } while (__iovec < piVar7);
  }
  puVar3 = puStack_140;
  if (piVar5 != (iovec *)0x0) {
    local_148 = (iovec *)0x0;
    puStack_140 = (undefined1 *)0x0;
    in_RAX = (**(code **)*local_138)(local_138,piVar5,0x10,puVar3,puVar3,0);
  }
  return in_RAX;
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation

  OutputStream::write(pieces);

#else
  const size_t iovmax = miniposix::iovMax(pieces.size());
  while (pieces.size() > iovmax) {
    write(pieces.slice(0, iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iov.end() - current), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}